

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpxpes_parser.cc
# Opt level: O2

bool __thiscall
libwebm::VpxPesParser::RemoveStartCodeEmulationPreventionBytes
          (VpxPesParser *this,uint8_t *raw_data,size_t bytes_required,PacketData *processed_data,
          size_t *bytes_consumed)

{
  uint8_t *puVar1;
  size_t sVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  uint8_t byte;
  uint8_t local_41;
  size_t *local_40;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_38;
  
  if (processed_data == (PacketData *)0x0 || bytes_required == 0) {
LAB_0010c454:
    bVar5 = false;
  }
  else {
    puVar1 = *(uint8_t **)(this + 0x60);
    lVar4 = 0;
    uVar3 = 0;
    sVar2 = 0;
    local_40 = bytes_consumed;
    local_38 = processed_data;
    while (uVar3 < bytes_required) {
      if (puVar1 < raw_data + sVar2) goto LAB_0010c454;
      local_41 = raw_data[sVar2];
      if (local_41 == '\0') {
        lVar4 = lVar4 + 1;
LAB_0010c43d:
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(local_38,&local_41);
        uVar3 = uVar3 + 1;
      }
      else {
        bVar5 = lVar4 != 2;
        lVar4 = 0;
        if (bVar5 || local_41 != '\x03') goto LAB_0010c43d;
        lVar4 = 0;
      }
      sVar2 = sVar2 + 1;
    }
    *local_40 = sVar2;
    bVar5 = true;
  }
  return bVar5;
}

Assistant:

bool VpxPesParser::RemoveStartCodeEmulationPreventionBytes(
    const std::uint8_t* raw_data, std::size_t bytes_required,
    PacketData* processed_data, std::size_t* bytes_consumed) const {
  if (bytes_required == 0 || !processed_data)
    return false;

  std::size_t num_zeros = 0;
  std::size_t bytes_copied = 0;
  const std::uint8_t* const end_of_input =
      &pes_file_data_[0] + pes_file_data_.size();
  std::size_t i;
  for (i = 0; bytes_copied < bytes_required; ++i) {
    if (raw_data + i > end_of_input)
      return false;

    bool skip = false;

    const std::uint8_t byte = raw_data[i];
    if (byte == 0) {
      ++num_zeros;
    } else if (byte == 0x3 && num_zeros == 2) {
      skip = true;
      num_zeros = 0;
    } else {
      num_zeros = 0;
    }

    if (skip == false) {
      processed_data->push_back(byte);
      ++bytes_copied;
    }
  }
  *bytes_consumed = i;
  return true;
}